

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O1

void __thiscall
btSimpleBroadphase::aabbTest
          (btSimpleBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  float *pfVar1;
  float fVar2;
  btSimpleBroadphaseProxy *pbVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  if (-1 < this->m_LastHandleIndex) {
    lVar7 = -1;
    lVar6 = 0;
    do {
      pbVar3 = this->m_pHandles;
      if (*(long *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMin.m_floats + lVar6 + -0x1c) != 0
         ) {
        pfVar1 = (float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMax.m_floats + lVar6);
        bVar5 = true;
        if ((aabbMin->m_floats[0] < *pfVar1 || aabbMin->m_floats[0] == *pfVar1) &&
           (fVar2 = *(float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMin.m_floats + lVar6),
           bVar5 = true, fVar2 < aabbMax->m_floats[0] || fVar2 == aabbMax->m_floats[0])) {
          bVar5 = false;
        }
        pfVar1 = (float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMax.m_floats + lVar6 + 8);
        bVar4 = true;
        if ((aabbMin->m_floats[2] < *pfVar1 || aabbMin->m_floats[2] == *pfVar1) &&
           (fVar2 = *(float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMin.m_floats +
                              lVar6 + 8),
           fVar2 < aabbMax->m_floats[2] || fVar2 == aabbMax->m_floats[2])) {
          bVar4 = bVar5;
        }
        pfVar1 = (float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMax.m_floats + lVar6 + 4);
        if ((aabbMin->m_floats[1] < *pfVar1 || aabbMin->m_floats[1] == *pfVar1) &&
           (fVar2 = *(float *)((long)(pbVar3->super_btBroadphaseProxy).m_aabbMin.m_floats +
                              lVar6 + 4),
           !bVar4 && (fVar2 < aabbMax->m_floats[1] || fVar2 == aabbMax->m_floats[1]))) {
          (*callback->_vptr_btBroadphaseAabbCallback[2])
                    (callback,(long)(pbVar3->super_btBroadphaseProxy).m_aabbMin.m_floats +
                              lVar6 + -0x1c);
        }
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x40;
    } while (lVar7 < this->m_LastHandleIndex);
  }
  return;
}

Assistant:

void	btSimpleBroadphase::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	for (int i=0; i <= m_LastHandleIndex; i++)
	{
		btSimpleBroadphaseProxy* proxy = &m_pHandles[i];
		if(!proxy->m_clientObject)
		{
			continue;
		}
		if (TestAabbAgainstAabb2(aabbMin,aabbMax,proxy->m_aabbMin,proxy->m_aabbMax))
		{
			callback.process(proxy);
		}
	}
}